

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::GetProtoPackagePrefixExceptionList_abi_cxx11_(void)

{
  string *in_RDI;
  
  (anonymous_namespace)::PrefixModeStorage::exception_path_abi_cxx11_
            (in_RDI,(anonymous_namespace)::g_prefix_mode);
  return in_RDI;
}

Assistant:

std::string GetProtoPackagePrefixExceptionList() {
  return g_prefix_mode.exception_path();
}